

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

int __thiscall OpenMD::StuntDouble::freeze(StuntDouble *this)

{
  int iVar1;
  
  setVel(this,(Vector3d *)OpenMD::V3Zero);
  setFrc(this,(Vector3d *)OpenMD::V3Zero);
  if (this->objType_ - otDAtom < 2) {
    setJ(this,(Vector3d *)OpenMD::V3Zero);
    setTrq(this,(Vector3d *)OpenMD::V3Zero);
    iVar1 = 6 - (uint)this->linear_;
  }
  else {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int freeze() {
      int fdf = 3;

      setVel(V3Zero);
      setFrc(V3Zero);
      if (isDirectional()) {
        setJ(V3Zero);
        setTrq(V3Zero);
        if (isLinear())
          fdf += 2;
        else
          fdf += 3;
      }
      return fdf;
    }